

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timestamp.cpp
# Opt level: O0

Timestamp * __thiscall mario::Timestamp::toFormattedString_abi_cxx11_(Timestamp *this)

{
  undefined1 auVar1 [16];
  long *in_RSI;
  allocator local_81;
  undefined1 local_80 [8];
  tm tm_time;
  long lStack_40;
  int microseconds;
  time_t seconds;
  char buf [32];
  Timestamp *this_local;
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  seconds = 0;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  lStack_40 = *in_RSI / 1000000;
  auVar1 = SEXT816(*in_RSI) * SEXT816(0x431bde82d7b634db);
  tm_time.tm_zone._4_4_ =
       (int)*in_RSI + ((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f)) * -1000000;
  gmtime_r(&stack0xffffffffffffffc0,(tm *)local_80);
  snprintf((char *)&seconds,0x20,"%4d%02d%02d %02d:%02d:%02d.%06d",(ulong)(tm_time.tm_mday + 0x76c),
           (ulong)(tm_time.tm_hour + 1),(ulong)(uint)tm_time.tm_min,tm_time.tm_sec,local_80._4_4_,
           local_80._0_4_,tm_time.tm_zone._4_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,(char *)&seconds,&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return this;
}

Assistant:

std::string Timestamp::toFormattedString() const {
  char buf[32] = {0};
  time_t seconds = static_cast<time_t>(_microSecondsSinceEpoch / kMicroSecondsPerSecond);
  int microseconds = static_cast<int>(_microSecondsSinceEpoch % kMicroSecondsPerSecond);
  struct tm tm_time;
  gmtime_r(&seconds, &tm_time);

  snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d.%06d",
      tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
      tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec,
      microseconds);
  return buf;
}